

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::UninterpretedOption_NamePart::SerializeWithCachedSizesToArray
          (UninterpretedOption_NamePart *this,uint8 *target)

{
  bool bVar1;
  int size;
  uint32 uVar2;
  char *data;
  string *str;
  uint8 *target_00;
  UnknownFieldSet *pUVar3;
  byte *local_a0;
  uint8 *target_local;
  UninterpretedOption_NamePart *this_local;
  uint8 *local_28;
  byte *local_10;
  
  bVar1 = has_name_part(this);
  local_a0 = target;
  if (bVar1) {
    name_part_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_part_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,size,SERIALIZE);
    str = name_part_abi_cxx11_(this);
    uVar2 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar2 < 0x80) {
      *target = (byte)uVar2;
      local_28 = target + 1;
    }
    else if (uVar2 < 0x4000) {
      *target = (byte)uVar2 | 0x80;
      target[1] = (uint8)(uVar2 >> 7);
      local_28 = target + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar2,target);
    }
    uVar2 = std::__cxx11::string::size();
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_28);
    local_a0 = io::CodedOutputStream::WriteStringToArray(str,target_00);
  }
  bVar1 = has_is_extension(this);
  if (bVar1) {
    bVar1 = is_extension(this);
    uVar2 = internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    if (uVar2 < 0x80) {
      *local_a0 = (byte)uVar2;
      local_10 = local_a0 + 1;
    }
    else if (uVar2 < 0x4000) {
      *local_a0 = (byte)uVar2 | 0x80;
      local_a0[1] = (byte)(uVar2 >> 7);
      local_10 = local_a0 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar2,local_a0);
    }
    local_a0 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_10);
  }
  pUVar3 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar3);
  if (!bVar1) {
    pUVar3 = unknown_fields(this);
    local_a0 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar3,local_a0);
  }
  return local_a0;
}

Assistant:

::google::protobuf::uint8* UninterpretedOption_NamePart::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // required string name_part = 1;
  if (has_name_part()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name_part().data(), this->name_part().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name_part(), target);
  }

  // required bool is_extension = 2;
  if (has_is_extension()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->is_extension(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}